

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::Image(RenderTexture *texture,Color *tintColor,Color *borderColor)

{
  uint uVar1;
  uint extraout_var;
  Vector2f local_20;
  
  uVar1 = (*(texture->super_RenderTarget)._vptr_RenderTarget[2])();
  local_20.x = (float)uVar1;
  local_20.y = (float)extraout_var;
  Image(texture,&local_20,tintColor,borderColor);
  return;
}

Assistant:

void Image(const sf::RenderTexture& texture, const sf::Color& tintColor,
           const sf::Color& borderColor) {
    Image(texture, static_cast<sf::Vector2f>(texture.getSize()), tintColor, borderColor);
}